

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::benchmarkEnded
          (ConsoleReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats)

{
  TablePrinter *tp;
  int iVar1;
  Duration local_78;
  Duration local_68;
  Duration local_58;
  Duration local_48;
  Duration local_38;
  Duration local_28;
  
  iVar1 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0x15])();
  tp = (this->m_tablePrinter).m_ptr;
  if ((char)iVar1 == '\0') {
    if (tp == (TablePrinter *)0x0) goto LAB_00198c6d;
    operator<<(tp);
    local_78.m_inNanoseconds = (stats->mean).point.__r;
    local_28.m_units = Nanoseconds;
    local_78.m_units = Nanoseconds;
    if (((1000.0 <= local_78.m_inNanoseconds) &&
        (local_78.m_units = Microseconds, 1000000.0 <= local_78.m_inNanoseconds)) &&
       (local_78.m_units = Milliseconds, 1000000000.0 <= local_78.m_inNanoseconds)) {
      local_78.m_units = local_78.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_78);
    operator<<(tp);
    local_28.m_inNanoseconds = (stats->mean).lower_bound.__r;
    if (((1000.0 <= local_28.m_inNanoseconds) &&
        (local_28.m_units = Microseconds, 1000000.0 <= local_28.m_inNanoseconds)) &&
       (local_28.m_units = Milliseconds, 1000000000.0 <= local_28.m_inNanoseconds)) {
      local_28.m_units = local_28.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_28);
    operator<<(tp);
    local_38.m_inNanoseconds = (stats->mean).upper_bound.__r;
    local_48.m_units = Nanoseconds;
    local_38.m_units = Nanoseconds;
    if (((1000.0 <= local_38.m_inNanoseconds) &&
        (local_38.m_units = Microseconds, 1000000.0 <= local_38.m_inNanoseconds)) &&
       (local_38.m_units = Milliseconds, 1000000000.0 <= local_38.m_inNanoseconds)) {
      local_38.m_units = local_38.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_38);
    operator<<(tp);
    operator<<(tp);
    local_48.m_inNanoseconds = (stats->standardDeviation).point.__r;
    if (((1000.0 <= local_48.m_inNanoseconds) &&
        (local_48.m_units = Microseconds, 1000000.0 <= local_48.m_inNanoseconds)) &&
       (local_48.m_units = Milliseconds, 1000000000.0 <= local_48.m_inNanoseconds)) {
      local_48.m_units = local_48.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_48);
    operator<<(tp);
    local_58.m_inNanoseconds = (stats->standardDeviation).lower_bound.__r;
    local_68.m_units = Nanoseconds;
    local_58.m_units = Nanoseconds;
    if (((1000.0 <= local_58.m_inNanoseconds) &&
        (local_58.m_units = Microseconds, 1000000.0 <= local_58.m_inNanoseconds)) &&
       (local_58.m_units = Milliseconds, 1000000000.0 <= local_58.m_inNanoseconds)) {
      local_58.m_units = local_58.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_58);
    operator<<(tp);
    local_68.m_inNanoseconds = (stats->standardDeviation).upper_bound.__r;
    if (((1000.0 <= local_68.m_inNanoseconds) &&
        (local_68.m_units = Microseconds, 1000000.0 <= local_68.m_inNanoseconds)) &&
       (local_68.m_units = Milliseconds, 1000000000.0 <= local_68.m_inNanoseconds)) {
      local_68.m_units = local_68.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_68);
    operator<<(tp);
    operator<<(tp);
    operator<<(tp);
    operator<<(tp);
  }
  else {
    if (tp == (TablePrinter *)0x0) {
LAB_00198c6d:
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.hpp"
                    ,0x4b0,
                    "T &Catch::Detail::unique_ptr<Catch::TablePrinter>::operator*() [T = Catch::TablePrinter]"
                   );
    }
    local_78.m_inNanoseconds = (stats->mean).point.__r;
    local_78.m_units = Nanoseconds;
    if (((1000.0 <= local_78.m_inNanoseconds) &&
        (local_78.m_units = Microseconds, 1000000.0 <= local_78.m_inNanoseconds)) &&
       (local_78.m_units = Milliseconds, 1000000000.0 <= local_78.m_inNanoseconds)) {
      local_78.m_units = local_78.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_78);
  }
  operator<<(tp);
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats<> const &stats) {
                if (m_config->benchmarkNoAnalysis())
                {
                    (*m_tablePrinter) << Duration(stats.mean.point.count()) << ColumnBreak();
                }
                else
                {
                    (*m_tablePrinter) << ColumnBreak()
                        << Duration(stats.mean.point.count()) << ColumnBreak()
                        << Duration(stats.mean.lower_bound.count()) << ColumnBreak()
                        << Duration(stats.mean.upper_bound.count()) << ColumnBreak() << ColumnBreak()
                        << Duration(stats.standardDeviation.point.count()) << ColumnBreak()
                        << Duration(stats.standardDeviation.lower_bound.count()) << ColumnBreak()
                        << Duration(stats.standardDeviation.upper_bound.count()) << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak();
                }
            }